

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

PatternCaseItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PatternCaseItemSyntax,slang::syntax::PatternSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax*,slang::parsing::Token,slang::syntax::StatementSyntax&>
          (BumpAllocator *this,PatternSyntax *args,Token *args_1,ExpressionSyntax **args_2,
          Token *args_3,StatementSyntax *args_4)

{
  ExpressionSyntax *pEVar1;
  Info *pIVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  PatternCaseItemSyntax *pPVar12;
  
  pPVar12 = (PatternCaseItemSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((PatternCaseItemSyntax *)this->endPtr < pPVar12 + 1) {
    pPVar12 = (PatternCaseItemSyntax *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(pPVar12 + 1);
  }
  TVar4 = args_1->kind;
  uVar5 = args_1->field_0x2;
  NVar6.raw = (args_1->numFlags).raw;
  uVar7 = args_1->rawLen;
  pIVar2 = args_1->info;
  pEVar1 = *args_2;
  TVar8 = args_3->kind;
  uVar9 = args_3->field_0x2;
  NVar10.raw = (args_3->numFlags).raw;
  uVar11 = args_3->rawLen;
  pIVar3 = args_3->info;
  (pPVar12->super_CaseItemSyntax).super_SyntaxNode.kind = PatternCaseItem;
  (pPVar12->super_CaseItemSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pPVar12->super_CaseItemSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pPVar12->pattern).ptr = args;
  (pPVar12->tripleAnd).kind = TVar4;
  (pPVar12->tripleAnd).field_0x2 = uVar5;
  (pPVar12->tripleAnd).numFlags = (NumericTokenFlags)NVar6.raw;
  (pPVar12->tripleAnd).rawLen = uVar7;
  (pPVar12->tripleAnd).info = pIVar2;
  pPVar12->expr = pEVar1;
  (pPVar12->colon).kind = TVar8;
  (pPVar12->colon).field_0x2 = uVar9;
  (pPVar12->colon).numFlags = (NumericTokenFlags)NVar10.raw;
  (pPVar12->colon).rawLen = uVar11;
  (pPVar12->colon).info = pIVar3;
  (pPVar12->statement).ptr = args_4;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pPVar12;
  if (pEVar1 != (ExpressionSyntax *)0x0) {
    (pEVar1->super_SyntaxNode).parent = (SyntaxNode *)pPVar12;
  }
  (args_4->super_SyntaxNode).parent = (SyntaxNode *)pPVar12;
  return pPVar12;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }